

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Poly::Get_y_dxdx(ChFunction_Poly *this,double x)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  long lVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  dVar5 = 0.0;
  if (1 < this->order) {
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 2;
      dVar2 = this->coeff[lVar4 + 2];
      auVar6._0_8_ = pow(x,(double)(int)lVar4);
      auVar6._8_56_ = extraout_var;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar5;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (double)((int)lVar1 * ((int)lVar4 + 1)) * dVar2;
      auVar3 = vfmadd231sd_fma(auVar7,auVar6._0_16_,auVar3);
      dVar5 = auVar3._0_8_;
      lVar4 = lVar4 + 1;
    } while (lVar1 < this->order);
  }
  return dVar5;
}

Assistant:

double ChFunction_Poly::Get_y_dxdx(double x) const {
    double total = 0;
    for (int i = 2; i <= order; i++) {
        total += ((double)(i * (i - 1)) * coeff[i] * pow(x, ((double)(i - 2))));
    }
    return total;
}